

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

VarConcat * __thiscall kratos::Var::concat(Var *this,Var *var)

{
  bool bVar1;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *pvVar2;
  size_type sVar3;
  const_reference ppVVar4;
  element_type *peVar5;
  enable_shared_from_this<kratos::Var> local_78;
  enable_shared_from_this<kratos::Var> local_68;
  undefined1 local_58 [8];
  shared_ptr<kratos::VarConcat> concat_ptr;
  shared_ptr<kratos::VarConcat> *exist_var;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
  *__range1;
  Var *ptr;
  Var *var_local;
  Var *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
           ::begin(&this->concat_vars_);
  exist_var = (shared_ptr<kratos::VarConcat> *)
              std::
              vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>
              ::end(&this->concat_vars_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
                                *)&exist_var);
    if (!bVar1) {
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_68);
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_78);
      std::make_shared<kratos::VarConcat,std::shared_ptr<kratos::Var>,std::shared_ptr<kratos::Var>>
                ((shared_ptr<kratos::Var> *)local_58,(shared_ptr<kratos::Var> *)&local_68);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_78);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_68);
      std::
      vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
      ::emplace_back<std::shared_ptr<kratos::VarConcat>&>
                ((vector<std::shared_ptr<kratos::VarConcat>,std::allocator<std::shared_ptr<kratos::VarConcat>>>
                  *)&this->concat_vars_,(shared_ptr<kratos::VarConcat> *)local_58);
      peVar5 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_58);
      std::shared_ptr<kratos::VarConcat>::~shared_ptr((shared_ptr<kratos::VarConcat> *)local_58);
      return peVar5;
    }
    concat_ptr.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
         ::operator*(&__end1);
    peVar5 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)concat_ptr.
                           super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
    pvVar2 = VarConcat::vars(peVar5);
    sVar3 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::size(pvVar2);
    if (sVar3 == 2) {
      peVar5 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)concat_ptr.
                               super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
      pvVar2 = VarConcat::vars(peVar5);
      ppVVar4 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::back(pvVar2);
      if (*ppVVar4 == var) {
        peVar5 = std::
                 __shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)concat_ptr.
                              super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
        return peVar5;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::VarConcat>_*,_std::vector<std::shared_ptr<kratos::VarConcat>,_std::allocator<std::shared_ptr<kratos::VarConcat>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

VarConcat &Var::concat(Var &var) {
    auto *ptr = &var;
    // notice that we effectively created an implicit sink->sink by creating a concat
    // however, it's not an assignment, that's why we need to use concat_vars to hold the
    // vars
    for (auto const &exist_var : concat_vars_) {
        // reuse the existing variables
        if (exist_var->vars().size() == 2 && exist_var->vars().back() == ptr) {
            return *exist_var;
        }
    }
    auto concat_ptr = std::make_shared<VarConcat>(shared_from_this(), ptr->shared_from_this());
    concat_vars_.emplace_back(concat_ptr);
    return *concat_ptr;
}